

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexHashMap.h
# Opt level: O0

bool Ptex::v2_2::memCompare(char *a,char *b,int len)

{
  uint uVar1;
  int iVar2;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  int i;
  uint64_t val64 [2];
  int len64;
  int local_3c;
  
  uVar1 = in_EDX & 0xfffffff8;
  local_3c = 0;
  while( true ) {
    if ((int)uVar1 <= local_3c) {
      iVar2 = memcmp((void *)(in_RDI + (int)uVar1),(void *)(in_RSI + (int)uVar1),
                     (long)(int)(in_EDX & 7));
      return iVar2 != 0;
    }
    if (*(long *)(in_RDI + local_3c) != *(long *)(in_RSI + local_3c)) break;
    local_3c = local_3c + 8;
  }
  return true;
}

Assistant:

inline bool memCompare(const char* a, const char* b, int len)
{
    int len64 = len & ~7;
    uint64_t val64[2];
    for (int i = 0; i < len64; i+=8) {
        memcpy(&val64[0], &a[i], 8);
        memcpy(&val64[1], &b[i], 8);
        if (val64[0] != val64[1]) return 1;
    }
    return memcmp(&a[len64], &b[len64], len & 7);
}